

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

void uv_sem_wait(uv_sem_t *sem)

{
  uv_mutex_t *mutex;
  int iVar1;
  int *piVar2;
  
  if (platform_needs_custom_semaphore != 0) {
    mutex = *(uv_mutex_t **)sem;
    uv_mutex_lock(mutex);
    while (*(int *)((long)mutex + 0x58) == 0) {
      uv_cond_wait((uv_cond_t *)(mutex + 1),mutex);
    }
    *(int *)((long)mutex + 0x58) = *(int *)((long)mutex + 0x58) + -1;
    uv_mutex_unlock(mutex);
    return;
  }
  do {
    iVar1 = sem_wait((sem_t *)sem);
    if (iVar1 != -1) {
      if (iVar1 == 0) {
        return;
      }
      break;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  abort();
}

Assistant:

void uv_sem_wait(uv_sem_t* sem) {
  if (platform_needs_custom_semaphore)
    uv__custom_sem_wait(sem);
  else
    uv__sem_wait(sem);
}